

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

void __thiscall
Model_takeImportedUnitsByIndex_Test::TestBody(Model_takeImportedUnitsByIndex_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_80 [8];
  Message local_78 [8];
  unsigned_long local_70 [2];
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  UnitsPtr takeUnits2;
  undefined1 local_30 [8];
  UnitsPtr takeUnits1;
  ModelPtr model;
  Model_takeImportedUnitsByIndex_Test *this_local;
  
  commonSetupImportedUnits();
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &takeUnits1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  libcellml::Model::takeUnits((ulong)local_30);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &takeUnits1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  libcellml::Model::takeUnits((ulong)&gtest_ar.message_);
  local_70[1] = 0;
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &takeUnits1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  local_70[0] = libcellml::Model::unitsCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_60,"size_t(0)","model->unitsCount()",local_70 + 1,local_70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/model.cpp"
               ,0x379,pcVar2);
    testing::internal::AssertHelper::operator=(local_80,local_78);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    testing::Message::~Message(local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)&gtest_ar.message_)
  ;
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_30);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &takeUnits1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(Model, takeImportedUnitsByIndex)
{
    auto model = commonSetupImportedUnits();

    auto takeUnits1 = model->takeUnits(0);
    auto takeUnits2 = model->takeUnits(0);

    EXPECT_EQ(size_t(0), model->unitsCount());
}